

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O0

void __thiscall crnlib::dxt_image::init_task(dxt_image *this,uint64 data,void *pData_ptr)

{
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  pack_params *p_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint y_00;
  uint x_00;
  crn_thread_id_t cVar6;
  color_quad<unsigned_char,_int> *other;
  color_quad<unsigned_char,_int> *local_ff8;
  uint local_fc8;
  uint ix;
  uint x;
  uint iy;
  uint y;
  uint pixel_ofs_x;
  color_quad_u8 pixels [16];
  uint progress_percentage;
  uint block_x;
  uint pixel_ofs_y;
  uint block_y;
  int prev_progress_percentage;
  set_block_pixels_context optimizer_context;
  uint block_index;
  bool is_main_thread;
  pack_params *p;
  image_u8 *img;
  init_task_params *pInit_params;
  uint thread_index;
  void *pData_ptr_local;
  uint64 data_local;
  dxt_image *this_local;
  
  this_00 = *(image<crnlib::color_quad<unsigned_char,_int>_> **)((long)pData_ptr + 8);
  p_00 = *(pack_params **)((long)pData_ptr + 0x10);
  cVar6 = crn_get_current_thread_id();
  optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_capacity._3_1_ =
       cVar6 == *(crn_thread_id_t *)((long)pData_ptr + 0x18);
  optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size = 0;
  set_block_pixels_context::set_block_pixels_context((set_block_pixels_context *)&block_y);
  pixel_ofs_y = 0xffffffff;
  block_x = 0;
  do {
    if (this->m_blocks_y <= block_x) {
LAB_001fb21b:
      set_block_pixels_context::~set_block_pixels_context((set_block_pixels_context *)&block_y);
      return;
    }
    for (progress_percentage = 0; progress_percentage < this->m_blocks_x;
        progress_percentage = progress_percentage + 1) {
      if (*(long *)((long)pData_ptr + 0x20) != 0) goto LAB_001fb21b;
      if (((p_00->m_pProgress_callback != (progress_callback_func)0x0) &&
          ((optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_capacity._3_1_ & 1) !=
           0)) && ((optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size & 0x3f)
                   == 0x3f)) {
        uVar5 = p_00->m_progress_start;
        iVar2 = optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size *
                p_00->m_progress_range;
        uVar3 = get_total_blocks(this);
        uVar4 = get_total_blocks(this);
        uVar5 = uVar5 + (iVar2 + (uVar3 >> 1)) / uVar4;
        if ((uVar5 != pixel_ofs_y) &&
           (bVar1 = (*p_00->m_pProgress_callback)(uVar5,p_00->m_pProgress_callback_user_data_ptr),
           pixel_ofs_y = uVar5, !bVar1)) {
          atomic_exchange32((atomic32_t *)((long)pData_ptr + 0x20),1);
          goto LAB_001fb21b;
        }
      }
      if ((p_00->m_num_helper_threads == 0) ||
         (optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size %
          (p_00->m_num_helper_threads + 1) == (uint)data)) {
        local_ff8 = (color_quad<unsigned_char,_int> *)&y;
        do {
          color_quad<unsigned_char,_int>::color_quad(local_ff8);
          local_ff8 = local_ff8 + 1;
        } while (local_ff8 != pixels + 0xe);
        for (x = 0; x < 4; x = x + 1) {
          uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(this_00);
          y_00 = math::minimum<unsigned_int>(block_x * 4 + x,uVar5 - 1);
          for (local_fc8 = 0; local_fc8 < 4; local_fc8 = local_fc8 + 1) {
            uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(this_00);
            x_00 = math::minimum<unsigned_int>(progress_percentage * 4 + local_fc8,uVar5 - 1);
            other = image<crnlib::color_quad<unsigned_char,_int>_>::operator()(this_00,x_00,y_00);
            color_quad<unsigned_char,_int>::operator=
                      ((color_quad<unsigned_char,_int> *)(&y + (local_fc8 + x * 4)),other);
          }
        }
        set_block_pixels(this,progress_percentage,block_x,(color_quad_u8 *)&y,p_00,
                         (set_block_pixels_context *)&block_y);
      }
      optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size =
           optimizer_context.m_etc1_optimizer.m_optimizer.m_temp_selectors.m_size + 1;
    }
    block_x = block_x + 1;
  } while( true );
}

Assistant:

void dxt_image::init_task(uint64 data, void* pData_ptr)
    {
        const uint thread_index = static_cast<uint>(data);
        init_task_params* pInit_params = static_cast<init_task_params*>(pData_ptr);

        const image_u8& img = *pInit_params->m_pImg;
        const pack_params& p = *pInit_params->m_pParams;
        const bool is_main_thread = (crn_get_current_thread_id() == pInit_params->m_main_thread);

        uint block_index = 0;

        set_block_pixels_context optimizer_context;
        int prev_progress_percentage = -1;

        for (uint block_y = 0; block_y < m_blocks_y; block_y++)
        {
            const uint pixel_ofs_y = block_y * cDXTBlockSize;

            for (uint block_x = 0; block_x < m_blocks_x; block_x++, block_index++)
            {
                if (pInit_params->m_canceled)
                {
                    return;
                }

                if (p.m_pProgress_callback && is_main_thread && ((block_index & 63) == 63))
                {
                    const uint progress_percentage = p.m_progress_start + ((block_index * p.m_progress_range + get_total_blocks() / 2) / get_total_blocks());
                    if ((int)progress_percentage != prev_progress_percentage)
                    {
                        prev_progress_percentage = progress_percentage;
                        if (!(p.m_pProgress_callback)(progress_percentage, p.m_pProgress_callback_user_data_ptr))
                        {
                            atomic_exchange32(&pInit_params->m_canceled, CRNLIB_TRUE);
                            return;
                        }
                    }
                }

                if (p.m_num_helper_threads)
                {
                    if ((block_index % (p.m_num_helper_threads + 1)) != thread_index)
                    {
                        continue;
                    }
                }

                color_quad_u8 pixels[cDXTBlockSize * cDXTBlockSize];

                const uint pixel_ofs_x = block_x * cDXTBlockSize;

                for (uint y = 0; y < cDXTBlockSize; y++)
                {
                    const uint iy = math::minimum(pixel_ofs_y + y, img.get_height() - 1);

                    for (uint x = 0; x < cDXTBlockSize; x++)
                    {
                        const uint ix = math::minimum(pixel_ofs_x + x, img.get_width() - 1);

                        pixels[x + y * cDXTBlockSize] = img(ix, iy);
                    }
                }

                set_block_pixels(block_x, block_y, pixels, p, optimizer_context);
            }
        }
    }